

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

ARGBBlendRow GetARGBBlend(void)

{
  int iVar1;
  _func_void_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_int *ARGBBlendRow;
  ARGBBlendRow local_8;
  
  iVar1 = libyuv::TestCpuFlag(0);
  if (iVar1 == 0) {
    local_8 = ARGBBlendRow_C;
  }
  else {
    local_8 = ARGBBlendRow_SSSE3;
  }
  return local_8;
}

Assistant:

LIBYUV_API
ARGBBlendRow GetARGBBlend() {
  void (*ARGBBlendRow)(const uint8_t* src_argb, const uint8_t* src_argb1,
                       uint8_t* dst_argb, int width) = ARGBBlendRow_C;
#if defined(HAS_ARGBBLENDROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    ARGBBlendRow = ARGBBlendRow_SSSE3;
    return ARGBBlendRow;
  }
#endif
#if defined(HAS_ARGBBLENDROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    ARGBBlendRow = ARGBBlendRow_NEON;
  }
#endif
#if defined(HAS_ARGBBLENDROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    ARGBBlendRow = ARGBBlendRow_MMI;
  }
#endif
#if defined(HAS_ARGBBLENDROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    ARGBBlendRow = ARGBBlendRow_MSA;
  }
#endif
  return ARGBBlendRow;
}